

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O3

void slang::mul(uint64_t *dst,uint64_t *x,uint32_t xlen,uint64_t *y,uint32_t ylen)

{
  ulong *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint32_t uVar9;
  uint xlen_00;
  uint ylen_00;
  uint uVar10;
  uint64_t *dst_00;
  uint64_t *puVar11;
  uint64_t *puVar12;
  ulong uVar13;
  ulong uVar14;
  uint32_t xlen_01;
  uint ylen_01;
  uint uVar15;
  uint64_t uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t __n;
  bool bVar20;
  TempBuffer<unsigned_long,_128UL> t1;
  TempBuffer<unsigned_long,_128UL> t2;
  uint64_t local_c50 [128];
  uint64_t *local_850;
  ulong local_848;
  uint64_t local_840 [128];
  uint64_t *local_440;
  ulong local_438;
  uint64_t local_430 [128];
  ulong uVar16;
  
  uVar14 = (ulong)xlen;
  if (ylen < 8 || xlen < 8) {
    if (xlen == 0) {
      uVar14 = 0;
      uVar17 = 0;
    }
    else {
      uVar18 = *y;
      uVar19 = 0;
      uVar17 = 0;
      do {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar17;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar18;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = x[uVar19];
        auVar7 = auVar3 * auVar5 + auVar7;
        uVar17 = auVar7._8_8_;
        dst[uVar19] = auVar7._0_8_;
        uVar19 = uVar19 + 1;
      } while (uVar14 != uVar19);
    }
    dst[uVar14] = uVar17;
    if (1 < ylen) {
      uVar18 = 1;
      do {
        if (xlen == 0) {
          uVar17 = 0;
        }
        else {
          uVar19 = 0;
          uVar17 = 0;
          do {
            auVar8._8_8_ = 0;
            auVar8._0_8_ = uVar17;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = y[uVar18];
            auVar6._8_8_ = 0;
            auVar6._0_8_ = x[uVar19];
            auVar8 = auVar4 * auVar6 + auVar8;
            uVar13 = auVar8._0_8_;
            puVar1 = dst + (uint)((int)uVar18 + (int)uVar19);
            uVar16 = *puVar1;
            *puVar1 = *puVar1 + uVar13;
            uVar17 = auVar8._8_8_ + (ulong)CARRY8(uVar16,uVar13);
            uVar19 = uVar19 + 1;
          } while (uVar14 != uVar19);
        }
        dst[(int)uVar18 + xlen] = uVar17;
        uVar18 = uVar18 + 1;
      } while (uVar18 != ylen);
    }
  }
  else {
    puVar12 = x;
    uVar9 = ylen;
    if (xlen <= ylen) {
      uVar14 = (ulong)ylen;
      puVar12 = y;
      y = x;
      uVar9 = xlen;
    }
    uVar18 = uVar14 >> 1;
    ylen_01 = (uint)uVar18;
    uVar19 = (ulong)uVar9;
    if (ylen_01 < uVar9) {
      uVar19 = uVar18;
    }
    xlen_01 = (uint32_t)uVar19;
    xlen_00 = uVar9 - xlen_01;
    ylen_00 = (uint)uVar14 - ylen_01;
    uVar15 = ylen + xlen;
    uVar16 = (ulong)uVar15;
    if (uVar15 < 0x81) {
      dst_00 = local_c50;
    }
    else {
      dst_00 = (uint64_t *)operator_new__(uVar16 * 8);
    }
    __n = uVar16 * 8;
    memset(dst_00,0,__n);
    mul(dst_00,y + uVar19,xlen_00,puVar12 + uVar18,ylen_00);
    memset(dst,0,__n);
    memcpy(dst + ((uint)uVar14 & 0xfffffffe),dst_00,(ulong)(ylen_00 + xlen_00) << 3);
    local_848 = uVar16;
    if (uVar15 < 0x81) {
      puVar11 = local_840;
    }
    else {
      puVar11 = (uint64_t *)operator_new__(__n);
    }
    local_850 = puVar11;
    memset(puVar11,0,__n);
    mul(puVar11,y,xlen_01,puVar12,ylen_01);
    puVar11 = local_850;
    memcpy(dst,local_850,(ulong)(xlen_01 + ylen_01) << 3);
    uVar10 = uVar15 - ylen_01;
    if (uVar10 != 0) {
      uVar14 = 0;
      bVar20 = false;
      do {
        puVar1 = dst + uVar18 + uVar14;
        uVar13 = (ulong)bVar20;
        uVar2 = *puVar1 - puVar11[uVar14];
        bVar20 = *puVar1 < puVar11[uVar14] || uVar2 < uVar13;
        *puVar1 = uVar2 - uVar13;
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
      uVar14 = 0;
      bVar20 = false;
      do {
        puVar1 = dst + uVar18 + uVar14;
        uVar13 = (ulong)bVar20;
        uVar2 = *puVar1 - dst_00[uVar14];
        bVar20 = *puVar1 < dst_00[uVar14] || uVar2 < uVar13;
        *puVar1 = uVar2 - uVar13;
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
    }
    memset(dst_00,0,uVar16 << 3);
    unevenAdd(dst_00,y + uVar19,xlen_00,y,xlen_01);
    memset(local_850,0,local_848 << 3);
    unevenAdd(local_850,puVar12 + uVar18,ylen_00,puVar12,ylen_01);
    local_438 = uVar16;
    if (uVar15 < 0x81) {
      puVar12 = local_430;
    }
    else {
      puVar12 = (uint64_t *)operator_new__(__n);
    }
    local_440 = puVar12;
    memset(puVar12,0,__n);
    if (xlen_00 < xlen_01) {
      xlen_00 = xlen_01;
    }
    if (ylen_00 < ylen_01) {
      ylen_00 = ylen_01;
    }
    mul(puVar12,dst_00,xlen_00 + 1,local_850,ylen_00 + 1);
    if (uVar15 != ylen_01) {
      uVar14 = 0;
      bVar20 = false;
      do {
        puVar1 = dst + uVar18 + uVar14;
        uVar19 = (ulong)bVar20;
        uVar13 = *puVar1 + local_440[uVar14];
        bVar20 = CARRY8(*puVar1,local_440[uVar14]) || CARRY8(uVar13,uVar19);
        *puVar1 = uVar13 + uVar19;
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
    }
    if (local_440 != (uint64_t *)0x0 && 0x80 < local_438) {
      operator_delete__(local_440);
    }
    if ((0x80 < local_848) && (local_850 != (uint64_t *)0x0)) {
      operator_delete__(local_850);
    }
    if ((0x80 < uVar16) && (dst_00 != (uint64_t *)0x0)) {
      operator_delete__(dst_00);
    }
  }
  return;
}

Assistant:

static void mul(uint64_t* dst, const uint64_t* x, uint32_t xlen, const uint64_t* y, uint32_t ylen) {
    if (xlen > 7 && ylen > 7) {
        mulKaratsuba(dst, x, xlen, y, ylen);
        return;
    }

    dst[xlen] = mulOne(dst, x, xlen, y[0]);
    for (uint32_t i = 1; i < ylen; i++) {
        uint64_t carry = 0;
        for (uint32_t j = 0; j < xlen; j++) {
            calc_out_t result;
            uint8_t c = addcarry64(0, mulTerm(x[j], y[i], carry), dst[i + j], &result);

            dst[i + j] = result;
            carry += c;
        }
        dst[i + xlen] = carry;
    }
}